

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::CreateTar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format,
               int compressionLevel)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  pointer pbVar5;
  Compress c;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string cwd;
  cmArchiveWrite a;
  ofstream fout;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  undefined1 local_310 [224];
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  GetCurrentWorkingDirectory_abi_cxx11_();
  std::ofstream::ofstream(local_230,(outFileName->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_007b7ec0 + (ulong)compressType * 4);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    if (format->_M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"paxr","");
    }
    else {
      pcVar1 = (format->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,pcVar1,pcVar1 + format->_M_string_length);
    }
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_310,(ostream *)local_230,c,&local_390,compressionLevel,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    bVar3 = cmArchiveWrite::Open((cmArchiveWrite *)local_310);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)(local_310 + 0x60));
      local_310[0x18] = verbose;
      pbVar5 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      if (pbVar5 != pbVar2) {
        do {
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          pcVar1 = (pbVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_390,pcVar1,pcVar1 + pbVar5->_M_string_length);
          bVar4 = cmsys::SystemTools::FileIsFullPath(&local_390);
          if (bVar4) {
            RelativePath(&local_370,&local_330,&local_390);
            std::__cxx11::string::operator=((string *)&local_390,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_350,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          bVar4 = cmArchiveWrite::Add((cmArchiveWrite *)local_310,&local_350,0,(char *)0x0,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
          }
          if (!bVar4) {
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_370,local_310._64_8_,
                       (pointer)(local_310._64_8_ + local_310._72_8_));
            Error(&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
            bVar3 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != pbVar2);
      }
    }
    else {
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,local_310._64_8_,
                 (pointer)(local_310._64_8_ + local_310._72_8_));
      Error(&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_310);
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    local_310._0_8_ = &DAT_00000019;
    local_310._8_8_ = "Cannot open output file \"";
    local_310._16_8_ = (archive *)0x0;
    local_310._32_8_ = (outFileName->_M_dataplus)._M_p;
    local_310._24_8_ = outFileName->_M_string_length;
    local_310._40_8_ = 0;
    local_310._48_8_ = 3;
    local_310._56_8_ = (long)"given invalid value for \"VIEW\": " + 0x1d;
    local_310._64_8_ = (pointer)0x0;
    local_310._72_8_ = local_370._M_string_length;
    local_310._80_8_ = local_370._M_dataplus._M_p;
    views._M_len = 4;
    views._M_array = (iterator)local_310;
    local_310._88_8_ = &local_370;
    cmCatViews(&local_390,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    Error(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::CreateTar(const std::string& outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format, int compressionLevel)
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName.c_str(), std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = cmStrCat("Cannot open output file \"", outFileName,
                             "\": ", cmSystemTools::GetLastSystemError());
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressZstd:
      compress = cmArchiveWrite::CompressZstd;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format,
                   compressionLevel);

  if (!a.Open()) {
    cmSystemTools::Error(a.GetError());
    return false;
  }
  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}